

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

void __thiscall QDockAreaLayout::clear(QDockAreaLayout *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    QList<QDockAreaLayoutItem>::clear
              ((QList<QDockAreaLayoutItem> *)((long)&this->docks[0].item_list.d.d + lVar2));
    puVar1 = (undefined8 *)((long)&this->docks[0].rect.x1.m_i + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0xffffffffffffffff;
    (&this->docks[0].tabbed)[lVar2] = false;
    *(undefined8 *)((long)&this->docks[0].tabBar + lVar2) = 0;
    lVar2 = lVar2 + 0x70;
  } while (lVar2 != 0x1c0);
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2 = -1;
  (this->centralWidgetRect).x1 = 0;
  (this->centralWidgetRect).y1 = 0;
  (this->centralWidgetRect).x2 = -1;
  (this->centralWidgetRect).y2 = -1;
  return;
}

Assistant:

void QDockAreaLayout::clear()
{
    for (int i = 0; i < QInternal::DockCount; ++i)
        docks[i].clear();

    rect = QRect();
    centralWidgetRect = QRect();
}